

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStream *pAVar1;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  _func_int **pp_Var2;
  undefined4 in_register_00000034;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>_>
  local_58;
  ArrayPtr<const_unsigned_char> *local_48;
  size_t sStack_40;
  Own<kj::_::PromiseNode> local_38;
  
  while( true ) {
    if (__n == 0) {
      Promise<void>::Promise((Promise<void> *)this);
      return (ssize_t)this;
    }
    if (((ArrayPtr<const_unsigned_char> *)__buf)->size_ != 0) break;
    __buf = (void *)((long)__buf + 0x10);
    __n = __n - 1;
  }
  pAVar1 = (((AsyncPipe *)CONCAT44(in_register_00000034,__fd))->state).ptr;
  if (pAVar1 != (AsyncIoStream *)0x0) {
    (*(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
              (this,&pAVar1->super_AsyncOutputStream,__buf);
    return (ssize_t)this;
  }
  local_48 = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
  sStack_40 = __n - 1;
  pp_Var2 = (_func_int **)operator_new(0x1d0);
  pp_Var2[1] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR_onReady_00430bc0;
  pp_Var2[2] = (_func_int *)&PTR_fulfill_00430c08;
  *(undefined1 *)(pp_Var2 + 3) = 0;
  *(undefined1 *)(pp_Var2 + 0x2f) = 0;
  *(undefined1 *)(pp_Var2 + 0x30) = 1;
  morePieces.size_ = sStack_40;
  morePieces.ptr = local_48;
  BlockedWrite::BlockedWrite
            ((BlockedWrite *)(pp_Var2 + 0x31),(PromiseFulfiller<void> *)(pp_Var2 + 2),
             (AsyncPipe *)CONCAT44(in_register_00000034,__fd),*__buf,morePieces);
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>>
        ::instance;
  local_38.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>>
        ::instance;
  local_58.ptr = (AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>
                  *)0x0;
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>>
        ::instance;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var2;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>_>::
  ~Own(&local_58);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    while (pieces.size() > 0 && pieces[0].size() == 0) {
      pieces = pieces.slice(1, pieces.size());
    }

    if (pieces.size() == 0) {
      return kj::READY_NOW;
    } else KJ_IF_MAYBE(s, state) {
      return s->write(pieces);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, pieces[0], pieces.slice(1, pieces.size()));
    }
  }